

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solver.cpp
# Opt level: O1

TxoutType Solver(CScript *scriptPubKey,
                vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                *vSolutionsRet)

{
  uint uVar1;
  pointer puVar2;
  opcodetype opcode_00;
  _Optional_payload_base<int> _Var3;
  bool bVar4;
  pointer puVar5;
  optional<int> oVar6;
  undefined8 uVar7;
  byte bVar8;
  uint uVar9;
  CScript *pCVar10;
  long lVar11;
  TxoutType TVar12;
  _Optional_payload_base<int> unaff_R12;
  ulong uVar13;
  size_t sVar14;
  long in_FS_OFFSET;
  initializer_list<unsigned_char> __l;
  initializer_list<unsigned_char> __l_00;
  initializer_list<unsigned_char> __l_01;
  vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  keys;
  vector<unsigned_char,_std::allocator<unsigned_char>_> witnessprogram;
  int witnessversion;
  const_iterator it;
  vector<unsigned_char,_std::allocator<unsigned_char>_> hashBytes;
  opcodetype opcode;
  vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  local_f8;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_d8;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_b8;
  int local_9c;
  valtype local_98;
  const_iterator local_80;
  value_type local_78;
  opcodetype local_5c;
  valtype local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  std::
  vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  ::_M_erase_at_end(vSolutionsRet,
                    (vSolutionsRet->
                    super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_start);
  bVar4 = CScript::IsPayToScriptHash(scriptPubKey);
  if (bVar4) {
    if (0x1c < (scriptPubKey->super_CScriptBase)._size) {
      scriptPubKey = (CScript *)(scriptPubKey->super_CScriptBase)._union.indirect_contents.indirect;
    }
    std::vector<unsigned_char,std::allocator<unsigned_char>>::
    vector<prevector<28u,unsigned_char,unsigned_int,int>::const_iterator,void>
              ((vector<unsigned_char,std::allocator<unsigned_char>> *)&local_78,
               (uchar *)((long)&(scriptPubKey->super_CScriptBase)._union + 2),
               (uchar *)((long)&(scriptPubKey->super_CScriptBase)._union + 0x16),
               (allocator_type *)&local_58);
    std::
    vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
    ::push_back(vSolutionsRet,&local_78);
    if (local_78.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start != (byte *)0x0) {
      operator_delete(local_78.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                      _M_impl.super__Vector_impl_data._M_start,
                      (long)local_78.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_78.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_start);
    }
    TVar12 = SCRIPTHASH;
  }
  else {
    local_b8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_b8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_b8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    bVar4 = CScript::IsWitnessProgram(scriptPubKey,&local_9c,&local_b8);
    if (bVar4) {
      if (local_9c == 0) {
        if ((long)local_b8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                  .super__Vector_impl_data._M_finish -
            (long)local_b8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                  .super__Vector_impl_data._M_start == 0x14) {
          TVar12 = WITNESS_V0_KEYHASH;
          std::
          vector<std::vector<unsigned_char,std::allocator<unsigned_char>>,std::allocator<std::vector<unsigned_char,std::allocator<unsigned_char>>>>
          ::emplace_back<std::vector<unsigned_char,std::allocator<unsigned_char>>>
                    ((vector<std::vector<unsigned_char,std::allocator<unsigned_char>>,std::allocator<std::vector<unsigned_char,std::allocator<unsigned_char>>>>
                      *)vSolutionsRet,&local_b8);
        }
        else {
          if ((long)local_b8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_finish -
              (long)local_b8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start != 0x20) goto LAB_003efe34;
          TVar12 = WITNESS_V0_SCRIPTHASH;
          std::
          vector<std::vector<unsigned_char,std::allocator<unsigned_char>>,std::allocator<std::vector<unsigned_char,std::allocator<unsigned_char>>>>
          ::emplace_back<std::vector<unsigned_char,std::allocator<unsigned_char>>>
                    ((vector<std::vector<unsigned_char,std::allocator<unsigned_char>>,std::allocator<std::vector<unsigned_char,std::allocator<unsigned_char>>>>
                      *)vSolutionsRet,&local_b8);
        }
      }
      else {
LAB_003efe34:
        if ((local_9c == 1) &&
           ((long)local_b8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                  .super__Vector_impl_data._M_finish -
            (long)local_b8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                  .super__Vector_impl_data._M_start == 0x20)) {
          TVar12 = WITNESS_V1_TAPROOT;
          std::
          vector<std::vector<unsigned_char,std::allocator<unsigned_char>>,std::allocator<std::vector<unsigned_char,std::allocator<unsigned_char>>>>
          ::emplace_back<std::vector<unsigned_char,std::allocator<unsigned_char>>>
                    ((vector<std::vector<unsigned_char,std::allocator<unsigned_char>>,std::allocator<std::vector<unsigned_char,std::allocator<unsigned_char>>>>
                      *)vSolutionsRet,&local_b8);
        }
        else {
          bVar4 = CScript::IsPayToAnchor(scriptPubKey);
          TVar12 = ANCHOR;
          if (!bVar4) {
            if (local_9c == 0) {
              TVar12 = NONSTANDARD;
            }
            else {
              local_58.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_start =
                   (pointer)CONCAT71(local_58.
                                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                     ._M_impl.super__Vector_impl_data._M_start._1_7_,(char)local_9c)
              ;
              __l._M_len = 1;
              __l._M_array = (iterator)&local_58;
              std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
                        (&local_78,__l,(allocator_type *)&local_98);
              std::
              vector<std::vector<unsigned_char,std::allocator<unsigned_char>>,std::allocator<std::vector<unsigned_char,std::allocator<unsigned_char>>>>
              ::emplace_back<std::vector<unsigned_char,std::allocator<unsigned_char>>>
                        ((vector<std::vector<unsigned_char,std::allocator<unsigned_char>>,std::allocator<std::vector<unsigned_char,std::allocator<unsigned_char>>>>
                          *)vSolutionsRet,&local_78);
              if (local_78.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                  .super__Vector_impl_data._M_start != (byte *)0x0) {
                operator_delete(local_78.
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl.super__Vector_impl_data._M_start,
                                (long)local_78.
                                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                      ._M_impl.super__Vector_impl_data._M_end_of_storage -
                                (long)local_78.
                                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                      ._M_impl.super__Vector_impl_data._M_start);
              }
              TVar12 = WITNESS_UNKNOWN;
              std::
              vector<std::vector<unsigned_char,std::allocator<unsigned_char>>,std::allocator<std::vector<unsigned_char,std::allocator<unsigned_char>>>>
              ::emplace_back<std::vector<unsigned_char,std::allocator<unsigned_char>>>
                        ((vector<std::vector<unsigned_char,std::allocator<unsigned_char>>,std::allocator<std::vector<unsigned_char,std::allocator<unsigned_char>>>>
                          *)vSolutionsRet,&local_b8);
            }
          }
        }
      }
    }
    else {
      uVar1 = (scriptPubKey->super_CScriptBase)._size;
      uVar9 = uVar1 - 0x1d;
      if (uVar1 < 0x1d) {
        uVar9 = uVar1;
      }
      if (uVar9 != 0) {
        pCVar10 = scriptPubKey;
        if (0x1c < uVar1) {
          pCVar10 = (CScript *)(scriptPubKey->super_CScriptBase)._union.indirect_contents.indirect;
        }
        if ((pCVar10->super_CScriptBase)._union.direct[0] == 'j') {
          bVar4 = CScript::IsPushOnly(scriptPubKey,
                                      (uchar *)((long)&(pCVar10->super_CScriptBase)._union + 1));
          TVar12 = NULL_DATA;
          if (bVar4) goto LAB_003f0460;
        }
      }
      local_d8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start = (byte *)0x0;
      local_d8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_finish = (byte *)0x0;
      local_d8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      uVar1 = (scriptPubKey->super_CScriptBase)._size;
      uVar9 = uVar1 - 0x1d;
      if (uVar1 < 0x1d) {
        uVar9 = uVar1;
      }
      if (uVar9 == 0x23) {
        pCVar10 = scriptPubKey;
        if (0x1c < uVar1) {
          pCVar10 = (CScript *)(scriptPubKey->super_CScriptBase)._union.indirect_contents.indirect;
        }
        if (((pCVar10->super_CScriptBase)._union.direct[0] != '!') ||
           (pCVar10[1].super_CScriptBase._union.direct[2] != -0x54)) goto LAB_003f010e;
        std::vector<unsigned_char,std::allocator<unsigned_char>>::
        vector<prevector<28u,unsigned_char,unsigned_int,int>::const_iterator,void>
                  ((vector<unsigned_char,std::allocator<unsigned_char>> *)&local_78,
                   (uchar *)((long)&(pCVar10->super_CScriptBase)._union + 1),
                   (uchar *)((long)&pCVar10[1].super_CScriptBase._union + 2),
                   (allocator_type *)&local_58);
LAB_003f000e:
        puVar2 = local_d8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage;
        puVar5 = local_d8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                 super__Vector_impl_data._M_start;
        local_d8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start =
             local_78.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_start;
        local_d8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_finish =
             local_78.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_finish;
        local_d8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage =
             local_78.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage;
        local_78.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start = (byte *)0x0;
        local_78.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_finish = (byte *)0x0;
        local_78.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        if (puVar5 != (byte *)0x0) {
          operator_delete(puVar5,(long)puVar2 - (long)puVar5);
        }
        if (local_78.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
            super__Vector_impl_data._M_start != (byte *)0x0) {
          operator_delete(local_78.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                          ._M_impl.super__Vector_impl_data._M_start,
                          (long)local_78.
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)local_78.
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl.super__Vector_impl_data._M_start);
        }
        if (local_d8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
            super__Vector_impl_data._M_finish ==
            local_d8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
            super__Vector_impl_data._M_start) goto LAB_003f010e;
        lVar11 = 0x21;
        if ((*local_d8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_start & 0xfe) != 2) {
          bVar8 = *local_d8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                   _M_impl.super__Vector_impl_data._M_start - 4;
          if (bVar8 < 4) {
            lVar11 = (&DAT_004b0788)[bVar8];
          }
          else {
            lVar11 = 0;
          }
        }
        if ((long)local_d8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                  .super__Vector_impl_data._M_finish -
            (long)local_d8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                  .super__Vector_impl_data._M_start != lVar11) goto LAB_003f010e;
        TVar12 = PUBKEY;
        std::
        vector<std::vector<unsigned_char,std::allocator<unsigned_char>>,std::allocator<std::vector<unsigned_char,std::allocator<unsigned_char>>>>
        ::emplace_back<std::vector<unsigned_char,std::allocator<unsigned_char>>>
                  ((vector<std::vector<unsigned_char,std::allocator<unsigned_char>>,std::allocator<std::vector<unsigned_char,std::allocator<unsigned_char>>>>
                    *)vSolutionsRet,&local_d8);
      }
      else {
        if (uVar9 == 0x43) {
          pCVar10 = scriptPubKey;
          if (0x1c < uVar1) {
            pCVar10 = (CScript *)(scriptPubKey->super_CScriptBase)._union.indirect_contents.indirect
            ;
          }
          if (((pCVar10->super_CScriptBase)._union.direct[0] == 'A') &&
             (pCVar10[2].super_CScriptBase._union.direct[2] == -0x54)) {
            std::vector<unsigned_char,std::allocator<unsigned_char>>::
            vector<prevector<28u,unsigned_char,unsigned_int,int>::const_iterator,void>
                      ((vector<unsigned_char,std::allocator<unsigned_char>> *)&local_78,
                       (uchar *)((long)&(pCVar10->super_CScriptBase)._union + 1),
                       (uchar *)((long)&pCVar10[2].super_CScriptBase._union + 2),
                       (allocator_type *)&local_58);
            goto LAB_003f000e;
          }
        }
LAB_003f010e:
        uVar1 = (scriptPubKey->super_CScriptBase)._size;
        uVar9 = uVar1 - 0x1d;
        if (uVar1 < 0x1d) {
          uVar9 = uVar1;
        }
        if (uVar9 == 0x19) {
          pCVar10 = scriptPubKey;
          if (0x1c < uVar1) {
            pCVar10 = (CScript *)(scriptPubKey->super_CScriptBase)._union.indirect_contents.indirect
            ;
          }
          if (((((pCVar10->super_CScriptBase)._union.direct[0] == 'v') &&
               ((pCVar10->super_CScriptBase)._union.direct[1] == -0x57)) &&
              ((pCVar10->super_CScriptBase)._union.direct[2] == '\x14')) &&
             (((pCVar10->super_CScriptBase)._union.direct[0x17] == -0x78 &&
              ((pCVar10->super_CScriptBase)._union.direct[0x18] == -0x54)))) {
            std::vector<unsigned_char,std::allocator<unsigned_char>>::
            vector<prevector<28u,unsigned_char,unsigned_int,int>::const_iterator,void>
                      ((vector<unsigned_char,std::allocator<unsigned_char>> *)&local_78,
                       (uchar *)((long)&(pCVar10->super_CScriptBase)._union + 3),
                       (uchar *)((long)&(pCVar10->super_CScriptBase)._union + 0x17),
                       (allocator_type *)&local_58);
            puVar2 = local_d8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                     _M_impl.super__Vector_impl_data._M_end_of_storage;
            puVar5 = local_d8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                     _M_impl.super__Vector_impl_data._M_start;
            local_d8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
            super__Vector_impl_data._M_start =
                 local_78.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                 super__Vector_impl_data._M_start;
            local_d8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
            super__Vector_impl_data._M_finish =
                 local_78.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                 super__Vector_impl_data._M_finish;
            local_d8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage =
                 local_78.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage;
            local_78.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
            super__Vector_impl_data._M_start = (byte *)0x0;
            local_78.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
            super__Vector_impl_data._M_finish = (byte *)0x0;
            local_78.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
            if (puVar5 != (byte *)0x0) {
              operator_delete(puVar5,(long)puVar2 - (long)puVar5);
            }
            if (local_78.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_start != (byte *)0x0) {
              operator_delete(local_78.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_start,
                              (long)local_78.
                                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                    ._M_impl.super__Vector_impl_data._M_end_of_storage -
                              (long)local_78.
                                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                    ._M_impl.super__Vector_impl_data._M_start);
            }
            TVar12 = PUBKEYHASH;
            std::
            vector<std::vector<unsigned_char,std::allocator<unsigned_char>>,std::allocator<std::vector<unsigned_char,std::allocator<unsigned_char>>>>
            ::emplace_back<std::vector<unsigned_char,std::allocator<unsigned_char>>>
                      ((vector<std::vector<unsigned_char,std::allocator<unsigned_char>>,std::allocator<std::vector<unsigned_char,std::allocator<unsigned_char>>>>
                        *)vSolutionsRet,&local_d8);
            goto LAB_003f0449;
          }
        }
        local_f8.
        super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        local_f8.
        super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        bVar4 = false;
        local_f8.
        super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        local_78.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        local_78.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start = (byte *)0x0;
        local_78.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_finish = (byte *)0x0;
        uVar1 = (scriptPubKey->super_CScriptBase)._size;
        local_80.ptr = (uchar *)(scriptPubKey->super_CScriptBase)._union.indirect_contents.indirect;
        uVar9 = uVar1 - 0x1d;
        if (uVar1 < 0x1d) {
          uVar9 = uVar1;
          local_80.ptr = (uchar *)scriptPubKey;
        }
        if (uVar9 != 0) {
          _Var3 = unaff_R12;
          if (((((CScript *)local_80.ptr)->super_CScriptBase)._union.direct[(int)(uVar9 - 1)] ==
               -0x52) &&
             (bVar4 = GetScriptOp(&local_80,
                                  (uchar *)((long)&(((CScript *)local_80.ptr)->super_CScriptBase).
                                                   _union + (long)(int)uVar9),&local_5c,&local_78),
             opcode_00 = local_5c, bVar4)) {
            local_58.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
            super__Vector_impl_data._M_start = (pointer)0x0;
            local_58.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
            super__Vector_impl_data._M_finish = (pointer)0x0;
            local_58.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
            uVar13 = (long)local_78.
                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                           .super__Vector_impl_data._M_finish -
                     (long)local_78.
                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                           .super__Vector_impl_data._M_start;
            if (uVar13 != 0) {
              if (-1 < (long)uVar13) {
                puVar5 = (pointer)operator_new(uVar13);
                goto LAB_003f02bb;
              }
              if (*(long *)(in_FS_OFFSET + 0x28) != local_38) goto LAB_003f07fb;
              std::__throw_bad_alloc();
LAB_003f067c:
              if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
                uVar7 = std::__throw_bad_alloc();
                if (local_98.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
                  operator_delete(local_98.
                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                  _M_impl.super__Vector_impl_data._M_start,
                                  (long)local_98.
                                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                        ._M_impl.super__Vector_impl_data._M_end_of_storage -
                                  (long)local_98.
                                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                        ._M_impl.super__Vector_impl_data._M_start);
                }
                if (local_78.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start != (byte *)0x0) {
                  operator_delete(local_78.
                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                  _M_impl.super__Vector_impl_data._M_start,
                                  (long)local_78.
                                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                        ._M_impl.super__Vector_impl_data._M_end_of_storage -
                                  (long)local_78.
                                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                        ._M_impl.super__Vector_impl_data._M_start);
                }
                std::
                vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                ::~vector(&local_f8);
                if (local_d8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start != (byte *)0x0) {
                  operator_delete(local_d8.
                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                  _M_impl.super__Vector_impl_data._M_start,
                                  (long)local_d8.
                                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                        ._M_impl.super__Vector_impl_data._M_end_of_storage -
                                  (long)local_d8.
                                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                        ._M_impl.super__Vector_impl_data._M_start);
                }
                if (local_b8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
                  operator_delete(local_b8.
                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                  _M_impl.super__Vector_impl_data._M_start,
                                  (long)local_b8.
                                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                        ._M_impl.super__Vector_impl_data._M_end_of_storage -
                                  (long)local_b8.
                                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                        ._M_impl.super__Vector_impl_data._M_start);
                }
                if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
                  _Unwind_Resume(uVar7);
                }
              }
              goto LAB_003f07fb;
            }
            puVar5 = (pointer)0x0;
LAB_003f02bb:
            local_58.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage = puVar5 + uVar13;
            sVar14 = (long)local_78.
                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                           .super__Vector_impl_data._M_finish -
                     (long)local_78.
                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                           .super__Vector_impl_data._M_start;
            local_58.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
            super__Vector_impl_data._M_start = puVar5;
            if (sVar14 != 0) {
              local_58.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_finish = puVar5;
              memmove(puVar5,local_78.
                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                             _M_impl.super__Vector_impl_data._M_start,sVar14);
            }
            local_58.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
            super__Vector_impl_data._M_finish = (pointer)((long)puVar5 + sVar14);
            unaff_R12 = (_Optional_payload_base<int>)GetScriptNumber(opcode_00,&local_58,1,0x14);
            if (local_58.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_start != (pointer)0x0) {
              operator_delete(local_58.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_start,
                              (long)local_58.
                                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                    ._M_impl.super__Vector_impl_data._M_end_of_storage -
                              (long)local_58.
                                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                    ._M_impl.super__Vector_impl_data._M_start);
            }
            _Var3 = (_Optional_payload_base<int>)((long)puVar5 + sVar14);
            if (((ulong)unaff_R12 >> 0x20 & 1) != 0) {
              while( true ) {
                uVar1 = (scriptPubKey->super_CScriptBase)._size;
                uVar9 = uVar1 - 0x1d;
                if (uVar1 < 0x1d) {
                  uVar9 = uVar1;
                }
                pCVar10 = (CScript *)
                          (scriptPubKey->super_CScriptBase)._union.indirect_contents.indirect;
                if (uVar1 < 0x1d) {
                  pCVar10 = scriptPubKey;
                }
                bVar4 = GetScriptOp(&local_80,
                                    (uchar *)((long)&(pCVar10->super_CScriptBase)._union +
                                             (long)(int)uVar9),&local_5c,&local_78);
                if ((!bVar4) ||
                   (local_78.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_finish ==
                    local_78.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start)) break;
                lVar11 = 0x21;
                if ((*local_78.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                      _M_impl.super__Vector_impl_data._M_start & 0xfe) != 2) {
                  bVar8 = *local_78.
                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                           .super__Vector_impl_data._M_start - 4;
                  if (bVar8 < 4) {
                    lVar11 = (&DAT_004b0788)[bVar8];
                  }
                  else {
                    lVar11 = 0;
                  }
                }
                if ((long)local_78.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                          ._M_impl.super__Vector_impl_data._M_finish -
                    (long)local_78.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                          ._M_impl.super__Vector_impl_data._M_start != lVar11) break;
                std::
                vector<std::vector<unsigned_char,std::allocator<unsigned_char>>,std::allocator<std::vector<unsigned_char,std::allocator<unsigned_char>>>>
                ::emplace_back<std::vector<unsigned_char,std::allocator<unsigned_char>>>
                          ((vector<std::vector<unsigned_char,std::allocator<unsigned_char>>,std::allocator<std::vector<unsigned_char,std::allocator<unsigned_char>>>>
                            *)&local_f8,&local_78);
              }
              local_98.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_start = (pointer)0x0;
              local_98.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_finish = (pointer)0x0;
              local_98.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
              uVar13 = (long)local_78.
                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                             _M_impl.super__Vector_impl_data._M_finish -
                       (long)local_78.
                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                             _M_impl.super__Vector_impl_data._M_start;
              if (uVar13 == 0) {
                puVar5 = (pointer)0x0;
              }
              else {
                if ((long)uVar13 < 0) goto LAB_003f067c;
                puVar5 = (pointer)operator_new(uVar13);
              }
              local_98.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage = puVar5 + uVar13;
              sVar14 = (long)local_78.
                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                             _M_impl.super__Vector_impl_data._M_finish -
                       (long)local_78.
                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                             _M_impl.super__Vector_impl_data._M_start;
              local_98.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_start = puVar5;
              if (sVar14 != 0) {
                local_98.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_finish = puVar5;
                memmove(puVar5,local_78.
                               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                               _M_impl.super__Vector_impl_data._M_start,sVar14);
              }
              local_98.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_finish = puVar5 + sVar14;
              oVar6 = GetScriptNumber(local_5c,&local_98,unaff_R12._M_payload._M_value,0x14);
              if (local_98.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                  .super__Vector_impl_data._M_start != (pointer)0x0) {
                operator_delete(local_98.
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl.super__Vector_impl_data._M_start,
                                (long)local_98.
                                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                      ._M_impl.super__Vector_impl_data._M_end_of_storage -
                                (long)local_98.
                                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                      ._M_impl.super__Vector_impl_data._M_start);
              }
              if ((((ulong)oVar6.super__Optional_base<int,_true,_true>._M_payload.
                           super__Optional_payload_base<int> & 0x100000000) == 0) ||
                 (((long)local_f8.
                         super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish -
                   (long)local_f8.
                         super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555 -
                  (long)oVar6.super__Optional_base<int,_true,_true>._M_payload.
                        super__Optional_payload_base<int>._M_payload != 0)) {
                bVar4 = false;
              }
              else {
                uVar1 = (scriptPubKey->super_CScriptBase)._size;
                uVar9 = uVar1 - 0x1d;
                if (uVar1 < 0x1d) {
                  uVar9 = uVar1;
                }
                if (uVar1 >= 0x1d) {
                  scriptPubKey = (CScript *)
                                 (scriptPubKey->super_CScriptBase)._union.indirect_contents.indirect
                  ;
                }
                bVar4 = local_80.ptr + 1 ==
                        (uchar *)((scriptPubKey->super_CScriptBase)._union.direct + (int)uVar9);
              }
              goto LAB_003f0344;
            }
          }
          unaff_R12 = _Var3;
          bVar4 = false;
        }
LAB_003f0344:
        if (local_78.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
            super__Vector_impl_data._M_start != (byte *)0x0) {
          operator_delete(local_78.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                          ._M_impl.super__Vector_impl_data._M_start,
                          (long)local_78.
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)local_78.
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl.super__Vector_impl_data._M_start);
        }
        if (bVar4) {
          local_58.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start =
               (pointer)CONCAT71(local_58.
                                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                 _M_impl.super__Vector_impl_data._M_start._1_7_,
                                 unaff_R12._M_payload._0_1_);
          __l_00._M_len = 1;
          __l_00._M_array = (iterator)&local_58;
          std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
                    (&local_78,__l_00,(allocator_type *)&local_98);
          std::
          vector<std::vector<unsigned_char,std::allocator<unsigned_char>>,std::allocator<std::vector<unsigned_char,std::allocator<unsigned_char>>>>
          ::emplace_back<std::vector<unsigned_char,std::allocator<unsigned_char>>>
                    ((vector<std::vector<unsigned_char,std::allocator<unsigned_char>>,std::allocator<std::vector<unsigned_char,std::allocator<unsigned_char>>>>
                      *)vSolutionsRet,&local_78);
          if (local_78.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_start != (byte *)0x0) {
            operator_delete(local_78.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_start,
                            (long)local_78.
                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                  _M_impl.super__Vector_impl_data._M_end_of_storage -
                            (long)local_78.
                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                  _M_impl.super__Vector_impl_data._M_start);
          }
          std::
          vector<std::vector<unsigned_char,std::allocator<unsigned_char>>,std::allocator<std::vector<unsigned_char,std::allocator<unsigned_char>>>>
          ::
          _M_range_insert<__gnu_cxx::__normal_iterator<std::vector<unsigned_char,std::allocator<unsigned_char>>*,std::vector<std::vector<unsigned_char,std::allocator<unsigned_char>>,std::allocator<std::vector<unsigned_char,std::allocator<unsigned_char>>>>>>
                    ((vector<std::vector<unsigned_char,std::allocator<unsigned_char>>,std::allocator<std::vector<unsigned_char,std::allocator<unsigned_char>>>>
                      *)vSolutionsRet,
                     (vSolutionsRet->
                     super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                     )._M_impl.super__Vector_impl_data._M_finish,
                     local_f8.
                     super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start,
                     local_f8.
                     super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish);
          local_58.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start =
               (pointer)CONCAT71(local_58.
                                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                 _M_impl.super__Vector_impl_data._M_start._1_7_,
                                 (char)((uint)((int)local_f8.
                                                  super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish -
                                              (int)local_f8.
                                                  super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start) >> 3) *
                                 -0x55);
          __l_01._M_len = 1;
          __l_01._M_array = (iterator)&local_58;
          std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
                    (&local_78,__l_01,(allocator_type *)&local_98);
          std::
          vector<std::vector<unsigned_char,std::allocator<unsigned_char>>,std::allocator<std::vector<unsigned_char,std::allocator<unsigned_char>>>>
          ::emplace_back<std::vector<unsigned_char,std::allocator<unsigned_char>>>
                    ((vector<std::vector<unsigned_char,std::allocator<unsigned_char>>,std::allocator<std::vector<unsigned_char,std::allocator<unsigned_char>>>>
                      *)vSolutionsRet,&local_78);
          if (local_78.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_start != (byte *)0x0) {
            operator_delete(local_78.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_start,
                            (long)local_78.
                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                  _M_impl.super__Vector_impl_data._M_end_of_storage -
                            (long)local_78.
                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                  _M_impl.super__Vector_impl_data._M_start);
          }
          TVar12 = MULTISIG;
        }
        else {
          std::
          vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
          ::_M_erase_at_end(vSolutionsRet,
                            (vSolutionsRet->
                            super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                            )._M_impl.super__Vector_impl_data._M_start);
          TVar12 = NONSTANDARD;
        }
        std::
        vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
        ::~vector(&local_f8);
      }
LAB_003f0449:
      if (local_d8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start != (byte *)0x0) {
        operator_delete(local_d8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                        _M_impl.super__Vector_impl_data._M_start,
                        (long)local_d8.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_d8.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_start);
      }
    }
LAB_003f0460:
    if (local_b8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_b8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                      _M_impl.super__Vector_impl_data._M_start,
                      (long)local_b8.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_b8.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_start);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return TVar12;
  }
LAB_003f07fb:
  __stack_chk_fail();
}

Assistant:

TxoutType Solver(const CScript& scriptPubKey, std::vector<std::vector<unsigned char>>& vSolutionsRet)
{
    vSolutionsRet.clear();

    // Shortcut for pay-to-script-hash, which are more constrained than the other types:
    // it is always OP_HASH160 20 [20 byte hash] OP_EQUAL
    if (scriptPubKey.IsPayToScriptHash())
    {
        std::vector<unsigned char> hashBytes(scriptPubKey.begin()+2, scriptPubKey.begin()+22);
        vSolutionsRet.push_back(hashBytes);
        return TxoutType::SCRIPTHASH;
    }

    int witnessversion;
    std::vector<unsigned char> witnessprogram;
    if (scriptPubKey.IsWitnessProgram(witnessversion, witnessprogram)) {
        if (witnessversion == 0 && witnessprogram.size() == WITNESS_V0_KEYHASH_SIZE) {
            vSolutionsRet.push_back(std::move(witnessprogram));
            return TxoutType::WITNESS_V0_KEYHASH;
        }
        if (witnessversion == 0 && witnessprogram.size() == WITNESS_V0_SCRIPTHASH_SIZE) {
            vSolutionsRet.push_back(std::move(witnessprogram));
            return TxoutType::WITNESS_V0_SCRIPTHASH;
        }
        if (witnessversion == 1 && witnessprogram.size() == WITNESS_V1_TAPROOT_SIZE) {
            vSolutionsRet.push_back(std::move(witnessprogram));
            return TxoutType::WITNESS_V1_TAPROOT;
        }
        if (scriptPubKey.IsPayToAnchor()) {
            return TxoutType::ANCHOR;
        }
        if (witnessversion != 0) {
            vSolutionsRet.push_back(std::vector<unsigned char>{(unsigned char)witnessversion});
            vSolutionsRet.push_back(std::move(witnessprogram));
            return TxoutType::WITNESS_UNKNOWN;
        }
        return TxoutType::NONSTANDARD;
    }

    // Provably prunable, data-carrying output
    //
    // So long as script passes the IsUnspendable() test and all but the first
    // byte passes the IsPushOnly() test we don't care what exactly is in the
    // script.
    if (scriptPubKey.size() >= 1 && scriptPubKey[0] == OP_RETURN && scriptPubKey.IsPushOnly(scriptPubKey.begin()+1)) {
        return TxoutType::NULL_DATA;
    }

    std::vector<unsigned char> data;
    if (MatchPayToPubkey(scriptPubKey, data)) {
        vSolutionsRet.push_back(std::move(data));
        return TxoutType::PUBKEY;
    }

    if (MatchPayToPubkeyHash(scriptPubKey, data)) {
        vSolutionsRet.push_back(std::move(data));
        return TxoutType::PUBKEYHASH;
    }

    int required;
    std::vector<std::vector<unsigned char>> keys;
    if (MatchMultisig(scriptPubKey, required, keys)) {
        vSolutionsRet.push_back({static_cast<unsigned char>(required)}); // safe as required is in range 1..20
        vSolutionsRet.insert(vSolutionsRet.end(), keys.begin(), keys.end());
        vSolutionsRet.push_back({static_cast<unsigned char>(keys.size())}); // safe as size is in range 1..20
        return TxoutType::MULTISIG;
    }

    vSolutionsRet.clear();
    return TxoutType::NONSTANDARD;
}